

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ValidationContextImpl::addId(ValidationContextImpl *this,XMLCh *content)

{
  XMLRefInfo *this_00;
  InvalidDatatypeValueException *this_01;
  
  if ((this->fIdRefList != (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0
      ) && (this->fToCheckIdRefList == true)) {
    this_00 = RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::get
                        (this->fIdRefList,content);
    if (this_00 == (XMLRefInfo *)0x0) {
      this_00 = (XMLRefInfo *)
                XMemory::operator_new(0x20,(this->super_ValidationContext).fMemoryManager);
      XMLRefInfo::XMLRefInfo
                (this_00,content,false,false,(this->super_ValidationContext).fMemoryManager);
      RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
                (this->fIdRefList,this_00->fRefName,this_00);
    }
    else if (this_00->fDeclared == true) {
      this_01 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ValidationContextImpl.cpp"
                 ,0x61,VALUE_ID_Not_Unique,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 (this->super_ValidationContext).fMemoryManager);
      __cxa_throw(this_01,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
    }
    this_00->fDeclared = true;
  }
  return;
}

Assistant:

void ValidationContextImpl::addId(const XMLCh * const content)
{
    if (!fIdRefList || !fToCheckIdRefList)
        return;

    XMLRefInfo* idEntry = fIdRefList->get(content);

    if (idEntry)
    {
        if (idEntry->getDeclared())
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_ID_Not_Unique
                    , content
                    , fMemoryManager);
        }
    }
    else
    {
        idEntry = new (fMemoryManager) XMLRefInfo(content, false, false, fMemoryManager);
        fIdRefList->put((void*)idEntry->getRefName(), idEntry);
    }

    //
    //  Mark it declared
    //
    idEntry->setDeclared(true);

}